

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode
JsDiagGetBreakOnException
          (JsRuntimeHandle runtimeHandle,JsDiagBreakOnExceptionAttributes *exceptionAttributes)

{
  bool bVar1;
  JsDiagBreakOnExceptionAttributes JVar2;
  JsrtRuntime *this;
  JsrtDebugManager *this_00;
  JsErrorCode JVar3;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else if (exceptionAttributes == (JsDiagBreakOnExceptionAttributes *)0x0) {
    JVar3 = JsErrorNullArgument;
  }
  else {
    *exceptionAttributes = JsDiagBreakOnExceptionAttributeNone;
    this = JsrtRuntime::FromHandle(runtimeHandle);
    this_00 = JsrtRuntime::GetJsrtDebugManager(this);
    JVar3 = JsErrorDiagNotInDebugMode;
    if (this_00 != (JsrtDebugManager *)0x0) {
      bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
      if (bVar1) {
        JVar2 = JsrtDebugManager::GetBreakOnException(this_00);
        *exceptionAttributes = JVar2;
        JVar3 = JsNoError;
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar3;
}

Assistant:

CHAKRA_API JsDiagGetBreakOnException(
    _In_ JsRuntimeHandle runtimeHandle,
    _Out_ JsDiagBreakOnExceptionAttributes* exceptionAttributes)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        PARAM_NOT_NULL(exceptionAttributes);

        *exceptionAttributes = JsDiagBreakOnExceptionAttributeNone;

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        *exceptionAttributes = jsrtDebugManager->GetBreakOnException();

        return JsNoError;
    });
#endif
}